

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_database.cc
# Opt level: O1

bool __thiscall
google::protobuf::SimpleDescriptorDatabase::DescriptorIndex<std::pair<const_void_*,_int>_>::AddFile
          (DescriptorIndex<std::pair<const_void_*,_int>_> *this,FileDescriptorProto *file,
          pair<const_void_*,_int> value)

{
  int iVar1;
  string *psVar2;
  pointer pcVar3;
  bool bVar4;
  bool bVar5;
  LogMessage *pLVar6;
  Type *pTVar7;
  Type *pTVar8;
  Type *pTVar9;
  Type *pTVar10;
  int iVar11;
  pair<const_void_*,_int> value_00;
  pair<const_void_*,_int> value_01;
  pair<const_void_*,_int> value_02;
  pair<const_void_*,_int> value_03;
  pair<const_void_*,_int> value_04;
  pair<const_void_*,_int> value_05;
  string path;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  second_type local_80;
  undefined1 local_70 [56];
  RepeatedPtrFieldBase *local_38;
  
  local_80.first = value.first;
  local_80.second = value.second;
  bVar4 = InsertIfNotPresent<std::map<std::__cxx11::string,std::pair<void_const*,int>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::pair<void_const*,int>>>>>
                    (&this->by_name_,(file->name_).ptr_,&local_80);
  if (!bVar4) {
    internal::LogMessage::LogMessage
              ((LogMessage *)local_70,LOGLEVEL_ERROR,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/descriptor_database.cc"
               ,0x39);
    pLVar6 = internal::LogMessage::operator<<
                       ((LogMessage *)local_70,"File already exists in database: ");
    pLVar6 = internal::LogMessage::operator<<(pLVar6,(file->name_).ptr_);
    internal::LogFinisher::operator=((LogFinisher *)&local_a0,pLVar6);
    internal::LogMessage::~LogMessage((LogMessage *)local_70);
    return false;
  }
  if (((file->_has_bits_).has_bits_[0] & 2) == 0) {
    local_70._0_8_ = local_70 + 0x10;
    local_70._8_8_ = (char *)0x0;
    local_70[0x10] = '\0';
  }
  else {
    psVar2 = (file->package_).ptr_;
    local_70._0_8_ = local_70 + 0x10;
    pcVar3 = (psVar2->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_70,pcVar3,pcVar3 + psVar2->_M_string_length);
  }
  if ((char *)local_70._8_8_ != (char *)0x0) {
    std::__cxx11::string::push_back((char)local_70);
  }
  if (0 < (file->message_type_).super_RepeatedPtrFieldBase.current_size_) {
    iVar11 = 0;
    do {
      pTVar7 = internal::RepeatedPtrFieldBase::
               Get<google::protobuf::RepeatedPtrField<google::protobuf::DescriptorProto>::TypeHandler>
                         (&(file->message_type_).super_RepeatedPtrFieldBase,iVar11);
      std::operator+(&local_a0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_70,
                     (pTVar7->name_).ptr_);
      value_00.second = local_80.second;
      value_00.first = local_80.first;
      value_00._12_4_ = 0;
      bVar4 = AddSymbol(this,&local_a0,value_00);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
        operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
      }
      if (!bVar4) goto LAB_005b803b;
      pTVar7 = internal::RepeatedPtrFieldBase::
               Get<google::protobuf::RepeatedPtrField<google::protobuf::DescriptorProto>::TypeHandler>
                         (&(file->message_type_).super_RepeatedPtrFieldBase,iVar11);
      value_01.second = local_80.second;
      value_01.first = local_80.first;
      value_01._12_4_ = 0;
      bVar4 = AddNestedExtensions(this,pTVar7,value_01);
      if (!bVar4) goto LAB_005b803b;
      iVar11 = iVar11 + 1;
    } while (iVar11 < (file->message_type_).super_RepeatedPtrFieldBase.current_size_);
  }
  if (0 < (file->enum_type_).super_RepeatedPtrFieldBase.current_size_) {
    iVar11 = 0;
    do {
      pTVar8 = internal::RepeatedPtrFieldBase::
               Get<google::protobuf::RepeatedPtrField<google::protobuf::EnumDescriptorProto>::TypeHandler>
                         (&(file->enum_type_).super_RepeatedPtrFieldBase,iVar11);
      std::operator+(&local_a0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_70,
                     (pTVar8->name_).ptr_);
      value_02.second = local_80.second;
      value_02.first = local_80.first;
      value_02._12_4_ = 0;
      bVar4 = AddSymbol(this,&local_a0,value_02);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
        operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
      }
      if (!bVar4) goto LAB_005b803b;
      iVar11 = iVar11 + 1;
    } while (iVar11 < (file->enum_type_).super_RepeatedPtrFieldBase.current_size_);
  }
  if (0 < (file->extension_).super_RepeatedPtrFieldBase.current_size_) {
    iVar11 = 0;
    do {
      pTVar9 = internal::RepeatedPtrFieldBase::
               Get<google::protobuf::RepeatedPtrField<google::protobuf::FieldDescriptorProto>::TypeHandler>
                         (&(file->extension_).super_RepeatedPtrFieldBase,iVar11);
      std::operator+(&local_a0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_70,
                     (pTVar9->name_).ptr_);
      value_03.second = local_80.second;
      value_03.first = local_80.first;
      value_03._12_4_ = 0;
      bVar4 = AddSymbol(this,&local_a0,value_03);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
        operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
      }
      if (!bVar4) goto LAB_005b803b;
      pTVar9 = internal::RepeatedPtrFieldBase::
               Get<google::protobuf::RepeatedPtrField<google::protobuf::FieldDescriptorProto>::TypeHandler>
                         (&(file->extension_).super_RepeatedPtrFieldBase,iVar11);
      value_04.second = local_80.second;
      value_04.first = local_80.first;
      value_04._12_4_ = 0;
      bVar4 = AddExtension(this,pTVar9,value_04);
      if (!bVar4) goto LAB_005b803b;
      iVar11 = iVar11 + 1;
    } while (iVar11 < (file->extension_).super_RepeatedPtrFieldBase.current_size_);
  }
  iVar11 = (file->service_).super_RepeatedPtrFieldBase.current_size_;
  bVar4 = iVar11 < 1;
  if (0 < iVar11) {
    local_38 = &(file->service_).super_RepeatedPtrFieldBase;
    iVar11 = 0;
    do {
      pTVar10 = internal::RepeatedPtrFieldBase::
                Get<google::protobuf::RepeatedPtrField<google::protobuf::ServiceDescriptorProto>::TypeHandler>
                          (local_38,iVar11);
      std::operator+(&local_a0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_70,
                     (pTVar10->name_).ptr_);
      value_05.second = local_80.second;
      value_05.first = local_80.first;
      value_05._12_4_ = 0;
      bVar5 = AddSymbol(this,&local_a0,value_05);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
        operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
      }
      if (!bVar5) break;
      iVar11 = iVar11 + 1;
      iVar1 = (file->service_).super_RepeatedPtrFieldBase.current_size_;
      bVar4 = iVar1 <= iVar11;
    } while (iVar11 < iVar1);
  }
LAB_005b803d:
  if ((undefined1 *)local_70._0_8_ != local_70 + 0x10) {
    operator_delete((void *)local_70._0_8_,CONCAT71(local_70._17_7_,local_70[0x10]) + 1);
  }
  return bVar4;
LAB_005b803b:
  bVar4 = false;
  goto LAB_005b803d;
}

Assistant:

bool SimpleDescriptorDatabase::DescriptorIndex<Value>::AddFile(
    const FileDescriptorProto& file,
    Value value) {
  if (!InsertIfNotPresent(&by_name_, file.name(), value)) {
    GOOGLE_LOG(ERROR) << "File already exists in database: " << file.name();
    return false;
  }

  // We must be careful here -- calling file.package() if file.has_package() is
  // false could access an uninitialized static-storage variable if we are being
  // run at startup time.
  string path = file.has_package() ? file.package() : string();
  if (!path.empty()) path += '.';

  for (int i = 0; i < file.message_type_size(); i++) {
    if (!AddSymbol(path + file.message_type(i).name(), value)) return false;
    if (!AddNestedExtensions(file.message_type(i), value)) return false;
  }
  for (int i = 0; i < file.enum_type_size(); i++) {
    if (!AddSymbol(path + file.enum_type(i).name(), value)) return false;
  }
  for (int i = 0; i < file.extension_size(); i++) {
    if (!AddSymbol(path + file.extension(i).name(), value)) return false;
    if (!AddExtension(file.extension(i), value)) return false;
  }
  for (int i = 0; i < file.service_size(); i++) {
    if (!AddSymbol(path + file.service(i).name(), value)) return false;
  }

  return true;
}